

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O2

string * __thiscall
helics::fileops::tomlAsString_abi_cxx11_
          (string *__return_storage_ptr__,fileops *this,value *element)

{
  fileops fVar1;
  ostringstream str;
  ostringstream local_190 [376];
  
  fVar1 = *this;
  if (fVar1 == (fileops)0x2) {
    CLI::std::__cxx11::to_string((string *)__return_storage_ptr__,*(long *)(this + 8));
  }
  else if (fVar1 == (fileops)0x3) {
    std::__cxx11::to_string(__return_storage_ptr__,*(double *)(this + 8));
  }
  else if (fVar1 == (fileops)0x4) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    toml::operator<<((ostream *)local_190,(basic_value<toml::type_config> *)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tomlAsString(const toml::value& element)
{
    switch (element.type()) {
        case toml::value_t::string:
            return element.as_string(std::nothrow_t());  // NOLINT
        case toml::value_t::floating:
            return std::to_string(element.as_floating(std::nothrow_t()));
        case toml::value_t::integer:
            return std::to_string(element.as_integer(std::nothrow_t()));
        default: {
            std::ostringstream str;
            str << element;
            return str.str();
        }
    }
}